

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceDynamicProfileManager.cpp
# Opt level: O0

DynamicProfileInfo * __thiscall
Js::SourceDynamicProfileManager::GetDynamicProfileInfo
          (SourceDynamicProfileManager *this,FunctionBody *functionBody)

{
  uint uVar1;
  bool bVar2;
  int iVar3;
  SourceContextInfo *pSVar4;
  DynamicProfileInfo *local_30;
  DynamicProfileInfo *dynamicProfileInfo;
  FunctionBody *pFStack_20;
  LocalFunctionId functionId;
  FunctionBody *functionBody_local;
  SourceDynamicProfileManager *this_local;
  
  pFStack_20 = functionBody;
  functionBody_local = (FunctionBody *)this;
  dynamicProfileInfo._4_4_ = FunctionProxy::GetLocalFunctionId((FunctionProxy *)functionBody);
  local_30 = (DynamicProfileInfo *)0x0;
  iVar3 = JsUtil::
          BaseDictionary<unsigned_int,_Js::DynamicProfileInfo_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
          ::Count(&this->dynamicProfileInfoMap);
  if ((0 < iVar3) &&
     (bVar2 = JsUtil::
              BaseDictionary<unsigned_int,_Js::DynamicProfileInfo_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
              ::TryGetValue<unsigned_int>
                        (&this->dynamicProfileInfoMap,(uint *)((long)&dynamicProfileInfo + 4),
                         &local_30), bVar2)) {
    bVar2 = DynamicProfileInfo::MatchFunctionBody(local_30,pFStack_20);
    if (bVar2) {
      return local_30;
    }
    bVar2 = Phases::IsEnabled((Phases *)&DAT_01ec1678,DynamicProfilePhase);
    uVar1 = dynamicProfileInfo._4_4_;
    if (bVar2) {
      pSVar4 = FunctionProxy::GetSourceContextInfo((FunctionProxy *)pFStack_20);
      Output::Print(L"TRACE: DynamicProfile: Profile data rejected for function %d in %s\n",
                    (ulong)uVar1,(pSVar4->field_5).field_0.url);
      Output::Flush();
    }
  }
  return (DynamicProfileInfo *)0x0;
}

Assistant:

DynamicProfileInfo *
    SourceDynamicProfileManager::GetDynamicProfileInfo(FunctionBody * functionBody)
    {
        Js::LocalFunctionId functionId = functionBody->GetLocalFunctionId();
        DynamicProfileInfo * dynamicProfileInfo = nullptr;
        if (dynamicProfileInfoMap.Count() > 0 && dynamicProfileInfoMap.TryGetValue(functionId, &dynamicProfileInfo))
        {
            if (dynamicProfileInfo->MatchFunctionBody(functionBody))
            {
                return dynamicProfileInfo;
            }

#if DBG_DUMP
            if (Js::Configuration::Global.flags.Trace.IsEnabled(Js::DynamicProfilePhase))
            {
                Output::Print(_u("TRACE: DynamicProfile: Profile data rejected for function %d in %s\n"),
                    functionId, functionBody->GetSourceContextInfo()->url);
                Output::Flush();
            }
#endif
            // NOTE: We have profile mismatch, we can invalidate all other profile here.
        }
        return nullptr;
    }